

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_operators.h
# Opt level: O0

void __thiscall
Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::set_characteristic
          (Zp_field_operators<unsigned_int,_void> *this,Characteristic characteristic)

{
  invalid_argument *piVar1;
  reference pvVar2;
  uint local_30;
  value_type local_2c;
  uint mult;
  uint inv;
  uint i;
  Characteristic characteristic_local;
  Zp_field_operators<unsigned_int,_void> *this_local;
  
  if (characteristic < 2) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar1,"Characteristic must be strictly positive and a prime number.");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->inverse_,(ulong)characteristic);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->inverse_,0);
  *pvVar2 = 0;
  mult = 1;
  do {
    if (characteristic <= mult) {
      this->characteristic_ = characteristic;
      return;
    }
    local_2c = 1;
    local_30 = mult;
    while (local_30 % characteristic != 1) {
      local_2c = local_2c + 1;
      if (local_30 == characteristic) {
        piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar1,"Characteristic must be a prime number.");
        __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_30 = local_2c * mult;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->inverse_,(ulong)mult);
    *pvVar2 = local_2c;
    mult = mult + 1;
  } while( true );
}

Assistant:

void set_characteristic(Characteristic characteristic) {
    if (characteristic <= 1)
      throw std::invalid_argument("Characteristic must be strictly positive and a prime number.");

    inverse_.resize(characteristic);
    inverse_[0] = 0;
    for (unsigned int i = 1; i < characteristic; ++i) {
      unsigned int inv = 1;
      unsigned int mult = inv * i;
      while ((mult % characteristic) != 1) {
        ++inv;
        if (mult == characteristic) throw std::invalid_argument("Characteristic must be a prime number.");
        mult = inv * i;
      }
      inverse_[i] = inv;
    }

    characteristic_ = characteristic;
  }